

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::draw_range_elements_base_vertex
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  ContextType CVar2;
  mapped_type *pmVar3;
  NotSupportedError *this;
  GLuint fbo;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  GLfloat vertices [1];
  string local_280;
  StringTemplate local_260;
  string local_240;
  string local_220;
  StringTemplate local_200;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ProgramSources local_1b0;
  ShaderProgram program;
  
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
    CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
    fbo = 0;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &args._M_t._M_impl.super__Rb_tree_header._M_header;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"GLSL_VERSION_STRING",(allocator<char> *)&local_1b0);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args,(key_type *)&program);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&program);
    renderCtx = ctx->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "${GLSL_VERSION_STRING}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
               &local_2a9);
    tcu::StringTemplate::StringTemplate(&local_200,&local_220);
    tcu::StringTemplate::specialize(&local_2a8,&local_200,&args);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,
               "${GLSL_VERSION_STRING}\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
               ,&local_2aa);
    tcu::StringTemplate::StringTemplate(&local_260,&local_280);
    tcu::StringTemplate::specialize(&local_240,&local_260,&args);
    glu::makeVtxFragSources(&local_1b0,&local_2a8,&local_240);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_1b0);
    glu::ProgramSources::~ProgramSources(&local_1b0);
    std::__cxx11::string::~string((string *)&local_240);
    tcu::StringTemplate::~StringTemplate(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a8);
    tcu::StringTemplate::~StringTemplate(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    NegativeTestContext::expectError(ctx,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"GL_INVALID_ENUM is generated if mode is not an accepted value."
               ,(allocator<char> *)&local_2a8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0xffffffff,0,1,1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               "GL_INVALID_ENUM is generated if type is not one of the accepted values.",
               (allocator<char> *)&local_2a8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,0,1,1,0xffffffff,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,0,1,1,0x1406,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"GL_INVALID_VALUE is generated if count is negative.",
               (allocator<char> *)&local_2a8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,0,1,-1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"GL_INVALID_VALUE is generated if end < start.",
               (allocator<char> *)&local_2a8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,1,0,1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
               ,(allocator<char> *)&local_2a8);
    NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
    glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
    glu::CallLogWrapper::glDrawRangeElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,0,1,1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0x506);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
    glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram(&program);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a 3.2 context or higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeVertexArrayApiTests.cpp"
             ,0x527);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void draw_range_elements_base_vertex (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a 3.2 context or higher context version.");

	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	GLfloat						vertices[1];
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawRangeElementsBaseVertex(-1, 0, 1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, -1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if end < start.");
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 1, 0, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawRangeElementsBaseVertex(GL_POINTS, 0, 1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	ctx.glUseProgram(0);
}